

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uregex.cpp
# Opt level: O2

int32_t uregex_replaceFirst_63
                  (URegularExpression *regexp2,UChar *replacementText,int32_t replacementLength,
                  UChar *destBuf,int32_t destCapacity,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  RegularExpression *regexp;
  int32_t destCapacity_local;
  UChar *destBuf_local;
  
  destCapacity_local = destCapacity;
  destBuf_local = destBuf;
  UVar1 = validateRE((RegularExpression *)regexp2,'\x01',status);
  if (UVar1 != '\0') {
    if (-2 < replacementLength && replacementText != (UChar *)0x0) {
      if ((-1 < destCapacity) && (destBuf != (UChar *)0x0 || destCapacity < 1)) {
        iVar3 = 0;
        uregex_reset64_63(regexp2,0,status);
        UVar1 = uregex_find64_63(regexp2,0,status);
        if (UVar1 != '\0') {
          iVar3 = icu_63::RegexCImpl::appendReplacement
                            ((RegularExpression *)regexp2,replacementText,replacementLength,
                             &destBuf_local,&destCapacity_local,status);
        }
        iVar2 = icu_63::RegexCImpl::appendTail
                          ((RegularExpression *)regexp2,&destBuf_local,&destCapacity_local,status);
        return iVar2 + iVar3;
      }
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uregex_replaceFirst(URegularExpression  *regexp2,
                    const UChar         *replacementText,
                    int32_t              replacementLength,
                    UChar               *destBuf,
                    int32_t              destCapacity,
                    UErrorCode          *status)  {
    RegularExpression *regexp = (RegularExpression*)regexp2;
    if (validateRE(regexp, TRUE, status) == FALSE) {
        return 0;
    }
    if (replacementText == NULL || replacementLength < -1 ||
        (destBuf == NULL && destCapacity > 0) ||
        destCapacity < 0) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    int32_t   len = 0;
    UBool     findSucceeded;
    uregex_reset(regexp2, 0, status);
    findSucceeded = uregex_find(regexp2, 0, status);
    if (findSucceeded) {
        len = uregex_appendReplacement(regexp2, replacementText, replacementLength,
                                       &destBuf, &destCapacity, status);
    }
    len += uregex_appendTail(regexp2, &destBuf, &destCapacity, status);

    return len;
}